

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::Vector<unsigned_char>::releaseAsArray
          (Array<unsigned_char> *__return_storage_ptr__,Vector<unsigned_char> *this)

{
  bool bVar1;
  size_t newSize;
  Vector<unsigned_char> *this_local;
  
  bVar1 = ArrayBuilder<unsigned_char>::isFull(&this->builder);
  if (!bVar1) {
    newSize = size(this);
    setCapacity(this,newSize);
  }
  ArrayBuilder<unsigned_char>::finish(__return_storage_ptr__,&this->builder);
  return __return_storage_ptr__;
}

Assistant:

inline Array<T> releaseAsArray() {
    // TODO(perf):  Avoid a copy/move by allowing Array<T> to point to incomplete space?
    if (!builder.isFull()) {
      setCapacity(size());
    }
    return builder.finish();
  }